

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::QuadraticLikeCost
          (QuadraticLikeCost *this,string *costName)

{
  Cost::Cost(&this->super_Cost,costName);
  (this->super_Cost)._vptr_Cost = (_func_int **)&PTR__QuadraticLikeCost_0019af10;
  (this->m_timeVaryingStateHessian).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_timeVaryingStateHessian).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_timeVaryingStateGradient).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_timeVaryingStateGradient).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_timeVaryingStateCostBias).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_timeVaryingStateCostBias).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_timeVaryingControlHessian).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_timeVaryingControlHessian).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_timeVaryingControlGradient).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_timeVaryingControlGradient).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_timeVaryingControlCostBias).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->m_timeVaryingControlCostBias).
  super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->m_timeVaryingControlCostBias).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi + 7) = 0;
  SparsityStructure::SparsityStructure(&this->m_secondPartialDerivativeWRTStateSparsity);
  SparsityStructure::SparsityStructure(&this->m_secondPartialDerivativeWRTControlSparsity);
  SparsityStructure::SparsityStructure(&this->m_secondPartialDerivativeWRTStateControlSparsity);
  return;
}

Assistant:

QuadraticLikeCost::QuadraticLikeCost(const std::string &costName)
            : Cost(costName)
            , m_timeVaryingStateHessian(nullptr)
            , m_timeVaryingStateGradient(nullptr)
            , m_timeVaryingStateCostBias(nullptr)
            , m_timeVaryingControlHessian(nullptr)
            , m_timeVaryingControlGradient(nullptr)
            , m_timeVaryingControlCostBias(nullptr)
            , m_hasSecondPartialDerivativeWRTStateSparsity(false)
            , m_hasSecondPartialDerivativeWRTControlSparsity(false)
            , m_hasSecondPartialDerivativeWRTStateControlSparsity(false)
        { }